

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O2

VmInstruction ** __thiscall
SmallDenseMap<VmInstruction_*,_VmInstruction_*,_VmInstructionHasher,_16U>::find
          (SmallDenseMap<VmInstruction_*,_VmInstruction_*,_VmInstructionHasher,_16U> *this,
          VmInstruction **key)

{
  uint uVar1;
  VmInstruction *pVVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  bool bVar6;
  
  uVar3 = this->bucketCount;
  uVar1 = uVar3 - 1;
  uVar5 = (*key)->uniqueId;
  iVar4 = 0;
  while( true ) {
    bVar6 = uVar3 == 0;
    uVar3 = uVar3 - 1;
    if (bVar6) {
      return (VmInstruction **)0x0;
    }
    uVar5 = uVar5 & uVar1;
    pVVar2 = this->data[uVar5].key;
    if (pVVar2 == (VmInstruction *)0x0) break;
    if (pVVar2 == *key) {
      return &this->data[uVar5].value;
    }
    uVar5 = uVar5 + iVar4 + 1;
    iVar4 = iVar4 + 1;
  }
  return (VmInstruction **)0x0;
}

Assistant:

Value* find(const Key& key) const
	{
		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = Hasher()(key) & bucketMask;

		for(unsigned i = 0; i < bucketCount; i++)
		{
			Node &item = data[bucket];

			if(item.key == Key())
				return NULL;

			if(item.key == key)
				return &item.value;

			// Quadratic probing
			bucket = (bucket + i + 1) & bucketMask;
		}

		return NULL;
	}